

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kvtree_mpi.c
# Opt level: O0

int kvtree_sendrecv(kvtree *hash_send,int rank_send,kvtree *hash_recv,int rank_recv,MPI_Comm comm)

{
  char *local_a8;
  char *buf_recv;
  char *buf_send;
  size_t max_int;
  size_t pack_size;
  int size_recv;
  int size_send;
  int have_incoming;
  int have_outgoing;
  MPI_Status status [2];
  MPI_Request request [2];
  int num_req;
  int rc;
  MPI_Comm comm_local;
  int rank_recv_local;
  kvtree *hash_recv_local;
  int rank_send_local;
  kvtree *hash_send_local;
  
  size_recv = 0;
  size_send = (int)(rank_send != -2);
  if (rank_recv != -2) {
    kvtree_unset_all(hash_recv);
  }
  size_recv = (int)(rank_recv != -2);
  pack_size._4_4_ = 0;
  pack_size._0_4_ = 0;
  request[1]._0_1_ = size_recv != 0;
  if (request[1]._0_1_) {
    MPI_Irecv(&pack_size,1,&ompi_mpi_int,rank_recv,0,comm,&status[1]._ucount);
  }
  request[1]._1_3_ = 0;
  if (size_send != 0) {
    max_int = kvtree_pack_size(hash_send);
    buf_send = (char *)0x7fffffff;
    if (0x7fffffff < max_int) {
      kvtree_abort(-1,"kvtree_sendrecv: hash size %lu is bigger than INT_MAX %d @ %s:%d",max_int,
                   0x7fffffff,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/ECP-VeloC[P]KVTree/src/kvtree_mpi.c"
                   ,0x7a);
    }
    pack_size._4_4_ = (int)max_int;
    MPI_Isend((long)&pack_size + 4,1,&ompi_mpi_int,rank_send,0,comm,
              request + (long)(int)(uint)request[1] + -1);
    request[1]._0_4_ = (uint)request[1] + 1;
  }
  if ((uint)request[1] != 0) {
    MPI_Waitall((uint)request[1],&status[1]._ucount,&have_incoming);
  }
  buf_recv = (char *)0x0;
  local_a8 = (char *)0x0;
  request[1]._0_1_ = 0 < (int)pack_size;
  if (request[1]._0_1_) {
    local_a8 = (char *)kvtree_malloc((long)(int)pack_size,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/ECP-VeloC[P]KVTree/src/kvtree_mpi.c"
                                     ,0x8d);
    MPI_Irecv(local_a8,(int)pack_size,&ompi_mpi_byte,rank_recv,0,comm,&status[1]._ucount);
  }
  request[1]._1_3_ = 0;
  if (0 < pack_size._4_4_) {
    buf_recv = (char *)kvtree_malloc((long)pack_size._4_4_,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/ECP-VeloC[P]KVTree/src/kvtree_mpi.c"
                                     ,0x93);
    kvtree_pack(buf_recv,hash_send);
    MPI_Isend(buf_recv,pack_size._4_4_,&ompi_mpi_byte,rank_send,0,comm,
              request + (long)(int)(uint)request[1] + -1);
    request[1]._0_4_ = (uint)request[1] + 1;
  }
  if ((uint)request[1] != 0) {
    MPI_Waitall((uint)request[1],&status[1]._ucount,&have_incoming);
  }
  if (0 < (int)pack_size) {
    kvtree_unpack(local_a8,hash_recv);
  }
  kvtree_free(&local_a8);
  kvtree_free(&buf_recv);
  return 0;
}

Assistant:

int kvtree_sendrecv(const kvtree* hash_send, int rank_send,
                            kvtree* hash_recv, int rank_recv,
                            MPI_Comm comm)
{
  int rc = KVTREE_SUCCESS;

  int num_req;
  MPI_Request request[2];
  MPI_Status  status[2];

  /* determine whether we have a rank to send to and a rank to receive from */
  int have_outgoing = 0;
  int have_incoming = 0;
  if (rank_send != MPI_PROC_NULL) {
    have_outgoing = 1;
  }
  if (rank_recv != MPI_PROC_NULL) {
    kvtree_unset_all(hash_recv);
    have_incoming = 1;
  }

  /* exchange hash pack sizes in order to allocate buffers */
  num_req = 0;
  int size_send = 0;
  int size_recv = 0;
  if (have_incoming) {
    MPI_Irecv(&size_recv, 1, MPI_INT, rank_recv, 0, comm, &request[num_req]);
    num_req++;
  }
  if (have_outgoing) {
    /* get size of packed hash and check that it doesn't exceed INT_MAX */
    size_t pack_size = kvtree_pack_size(hash_send);
    size_t max_int = (size_t) INT_MAX;
    if (pack_size > max_int) {
      kvtree_abort(-1, "kvtree_sendrecv: hash size %lu is bigger than INT_MAX %d @ %s:%d",
        (unsigned long) pack_size, INT_MAX, __FILE__, __LINE__
      );
    }

    /* tell rank how big the pack size is */
    size_send = (int) pack_size;
    MPI_Isend(&size_send, 1, MPI_INT, rank_send, 0, comm, &request[num_req]);
    num_req++;
  }
  if (num_req > 0) {
    MPI_Waitall(num_req, request, status);
  }

  /* allocate space to pack our hash and space to receive the incoming hash */
  num_req = 0;
  char* buf_send = NULL;
  char* buf_recv = NULL;
  if (size_recv > 0) {
    /* allocate space to receive a packed hash, and receive it */
    buf_recv = (char*) KVTREE_MALLOC((size_t)size_recv);
    MPI_Irecv(buf_recv, size_recv, MPI_BYTE, rank_recv, 0, comm, &request[num_req]);
    num_req++;
  }
  if (size_send > 0) {
    /* allocate space, pack our hash, and send it */
    buf_send = (char*) KVTREE_MALLOC((size_t)size_send);
    kvtree_pack(buf_send, hash_send);
    MPI_Isend(buf_send, size_send, MPI_BYTE, rank_send, 0, comm, &request[num_req]);
    num_req++;
  }
  if (num_req > 0) {
    MPI_Waitall(num_req, request, status);
  }

  /* unpack the hash into the hash_recv provided by the caller */
  if (size_recv > 0) {
    kvtree_unpack(buf_recv, hash_recv);
  }

  /* free the pack buffers */
  kvtree_free(&buf_recv);
  kvtree_free(&buf_send);

  return rc;
}